

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filter-ex.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  bool bVar6;
  allocator local_e9;
  char **local_e8;
  undefined4 local_e0 [2];
  string *local_d8;
  undefined8 local_d0;
  VideoCapture cap;
  Mat frame;
  
  ac::init();
  if (argc == 2) {
    std::__cxx11::string::string((string *)&frame,argv[1],(allocator *)local_e0);
    cv::VideoCapture::VideoCapture(&cap,(string *)&frame,0);
    std::__cxx11::string::~string((string *)&frame);
    cVar1 = cv::VideoCapture::isOpened();
    local_e8 = argv;
    if (cVar1 != '\0') {
      lVar5 = 0;
      while( true ) {
        iVar2 = ac::getFilterCount();
        if (iVar2 <= lVar5) break;
        iVar2 = 0x1e;
        while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
          cv::Mat::Mat(&frame);
          local_d0 = 0;
          local_e0[0] = 0x2010000;
          local_d8 = (string *)&frame;
          cVar1 = cv::VideoCapture::read((_OutputArray *)&cap);
          if (cVar1 == '\0') {
            std::__cxx11::string::string((string *)local_e0,local_e8[1],&local_e9);
            cv::VideoCapture::open((string *)&cap,(int)(string *)local_e0);
            std::__cxx11::string::~string((string *)local_e0);
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"[");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar5);
            poVar4 = std::operator<<(poVar4,"/");
            iVar3 = ac::getFilterCount();
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
            poVar4 = std::operator<<(poVar4,"] - calling.. ");
            poVar4 = std::operator<<(poVar4,(string *)(ac::draw_strings_abi_cxx11_ + lVar5 * 0x20));
            std::operator<<(poVar4,"\n");
            ac::CallFilter((int)lVar5,&frame);
            poVar4 = std::operator<<((ostream *)&std::cout,"call complete [");
            poVar4 = std::operator<<(poVar4,(string *)(ac::draw_strings_abi_cxx11_ + lVar5 * 0x20));
            std::operator<<(poVar4,"]\n");
          }
          cv::Mat::~Mat(&frame);
        }
        lVar5 = lVar5 + 1;
      }
      cv::VideoCapture::~VideoCapture(&cap);
      return 0;
    }
    std::operator<<((ostream *)&std::cerr,"Error capture device not opened..\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error requires file argument..\n");
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    
    ac::init();
    
    if(argc != 2) {
        std::cerr << "Error requires file argument..\n";
        exit(EXIT_FAILURE);
    }
    cv::VideoCapture cap(argv[1]);
    if(!cap.isOpened()) {
        std::cerr << "Error capture device not opened..\n";
        exit(EXIT_FAILURE);
    }
    for(int i = 0; i < ac::getFilterCount(); ++i) {
        
        //	if( ac::draw_strings[i].find("Shuffle") != std::string::npos ||  ac::draw_strings[i].find("Rand") != std::string::npos ||  ac::draw_strings[i].find("Frame") != std::string::npos )
        //		continue;
        
        //		if(ac::draw_strings[i].find("Random") != std::string::npos)
        //			continue;
        
        for(int q = 0; q < 30; ++q) {
            cv::Mat frame;
            if(cap.read(frame)) {
                std::cout << "[" << i << "/" << ac::getFilterCount() << "] - calling.. " << ac::draw_strings[i] << "\n";
                ac::CallFilter(i, frame);
                std::cout << "call complete [" << ac::draw_strings[i] << "]\n";
            } else {
                cap.open(argv[1]);
            }
        }
    }
    return 0;
}